

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O1

Index __thiscall
wasm::StackIROptimizer::getNumConsumedValues(StackIROptimizer *this,StackInst *inst)

{
  Index IVar1;
  AbstractChildIterator<wasm::ChildIterator> local_58;
  
  if (inst->op == Basic) {
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_58,inst->origin);
    IVar1 = (int)((ulong)((long)local_58.children.flexible.
                                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_58.children.flexible.
                               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) +
            (int)local_58.children.usedFixed;
    if (local_58.children.flexible.
        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.children.flexible.
                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.children.flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.children.flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    IVar1 = (Index)(inst->op == IfBegin);
  }
  return IVar1;
}

Assistant:

Index StackIROptimizer::getNumConsumedValues(StackInst* inst) {
  if (isControlFlow(inst)) {
    // If consumes 1; that's it.
    if (inst->op == StackInst::IfBegin) {
      return 1;
    }
    return 0;
  }
  // Otherwise, for basic instructions, just count the expression children.
  return ChildIterator(inst->origin).children.size();
}